

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflectance.cpp
# Opt level: O0

Spectrum * __thiscall
phyr::SpecularReflection::sample_f
          (SpecularReflection *this,Vector3f *wo,Vector3f *wi,Point2f *sample,double *pdf,
          BxDFType *sampledType)

{
  Vector3f *in_RCX;
  double *in_RDX;
  long in_RSI;
  CoefficientSpectrum<60> *in_RDI;
  undefined8 *in_R9;
  CoefficientSpectrum<60> *in_stack_fffffffffffff9f8;
  SampledSpectrum *this_00;
  CoefficientSpectrum<60> *in_stack_fffffffffffffa20;
  Vector3<double> local_40;
  undefined8 *local_28;
  Vector3f *local_18;
  
  local_28 = in_R9;
  local_18 = in_RCX;
  Vector3<double>::Vector3(&local_40,-*in_RDX,-in_RDX[1],in_RDX[2]);
  local_18->x = local_40.x;
  local_18->y = local_40.y;
  local_18->z = local_40.z;
  *local_28 = 0x3ff0000000000000;
  this_00 = *(SampledSpectrum **)(in_RSI + 0x1f0);
  cosTheta(local_18);
  (**(code **)(this_00->super_CoefficientSpectrum<60>).samples[0])(&stack0xfffffffffffffa20);
  CoefficientSpectrum<60>::operator*(in_stack_fffffffffffffa20,in_RDI);
  absCosTheta((Vector3f *)0x1ac823);
  CoefficientSpectrum<60>::operator/(in_stack_fffffffffffffa20,(double)in_RDI);
  SampledSpectrum::SampledSpectrum(this_00,in_stack_fffffffffffff9f8);
  return (Spectrum *)in_RDI;
}

Assistant:

Spectrum SpecularReflection::sample_f(const Vector3f& wo, Vector3f* wi,
                                      const Point2f& sample, Real* pdf,
                                      BxDFType* sampledType) const {
    // Compute perfect specular reflection direction.
    // According to the shading coordinate space, n = (0, 0, 1),
    // so calculating the reflection vector for {wo} over {n}
    // is simplified to the following.
    *wi = Vector3f(-wo.x, -wo.y, wo.z);
    *pdf = 1;
    return fresnel->evaluate(cosTheta(*wi)) * R / absCosTheta(*wi);
}